

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_dict(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  long lVar8;
  xmlChar *pxVar9;
  int test_ret_2;
  xmlChar *in_RSI;
  xmlChar *pxVar10;
  int n_dict;
  ulong uVar11;
  int n_sub;
  uint uVar12;
  int local_44;
  uint local_40;
  int test_ret;
  uint local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing dict : 10 of 13 functions ...");
  }
  iVar1 = xmlMemBlocks();
  xmlDictCleanup();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    in_RSI = (xmlChar *)(ulong)(uint)(iVar3 - iVar1);
    printf("Leak of %d blocks found in xmlDictCleanup");
    putchar(10);
  }
  local_38 = (uint)(iVar1 != iVar2);
  function_tests = function_tests + 1;
  iVar1 = xmlMemBlocks();
  uVar7 = xmlDictCreate();
  xmlDictFree(uVar7);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    in_RSI = (xmlChar *)(ulong)(uint)(iVar3 - iVar1);
    printf("Leak of %d blocks found in xmlDictCreate");
    putchar(10);
  }
  local_40 = (uint)(iVar1 != iVar2);
  function_tests = function_tests + 1;
  test_ret = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    iVar1 = xmlMemBlocks();
    if (uVar12 == 0) {
      lVar8 = xmlDictCreate();
    }
    else {
      lVar8 = 0;
    }
    uVar7 = xmlDictCreateSub(lVar8);
    xmlDictFree(uVar7);
    call_tests = call_tests + 1;
    if (lVar8 != 0) {
      xmlDictFree(lVar8);
    }
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDictCreateSub",(ulong)(uint)(iVar2 - iVar1));
      test_ret = test_ret + 1;
      in_RSI = (xmlChar *)(ulong)uVar12;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_34 = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    uVar11 = 0;
    while (iVar1 = (int)uVar11, iVar1 != 5) {
      pxVar10 = (xmlChar *)0x0;
      while( true ) {
        iVar2 = (int)in_RSI;
        iVar3 = (int)pxVar10;
        if (iVar3 == 4) break;
        iVar4 = xmlMemBlocks();
        if (uVar12 == 0) {
          lVar8 = xmlDictCreate();
        }
        else {
          lVar8 = 0;
        }
        in_RSI = gen_const_xmlChar_ptr(iVar1,iVar2);
        iVar2 = gen_int(iVar3,iVar2);
        if ((in_RSI != (xmlChar *)0x0) && (iVar5 = xmlStrlen(in_RSI), iVar5 < iVar2)) {
          iVar2 = 0;
        }
        xmlDictExists(lVar8,in_RSI,iVar2);
        call_tests = call_tests + 1;
        if (lVar8 != 0) {
          xmlDictFree(lVar8);
        }
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar4 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDictExists",(ulong)(uint)(iVar2 - iVar4));
          local_34 = local_34 + 1;
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar11);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar10;
        }
        pxVar10 = (xmlChar *)(ulong)(iVar3 + 1);
      }
      uVar11 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar1 = local_40 + local_38;
  local_38 = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    uVar11 = 0;
    while (iVar2 = (int)uVar11, iVar2 != 5) {
      pxVar10 = (xmlChar *)0x0;
      while( true ) {
        iVar3 = (int)in_RSI;
        iVar4 = (int)pxVar10;
        if (iVar4 == 4) break;
        iVar5 = xmlMemBlocks();
        if (uVar12 == 0) {
          lVar8 = xmlDictCreate();
        }
        else {
          lVar8 = 0;
        }
        in_RSI = gen_const_xmlChar_ptr(iVar2,iVar3);
        iVar3 = gen_int(iVar4,iVar3);
        if ((in_RSI != (xmlChar *)0x0) && (iVar6 = xmlStrlen(in_RSI), iVar6 < iVar3)) {
          iVar3 = 0;
        }
        xmlDictLookup(lVar8,in_RSI,iVar3);
        call_tests = call_tests + 1;
        if (lVar8 != 0) {
          xmlDictFree(lVar8);
        }
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar5 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDictLookup",(ulong)(uint)(iVar3 - iVar5));
          local_38 = local_38 + 1;
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar11);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar10;
        }
        pxVar10 = (xmlChar *)(ulong)(iVar4 + 1);
      }
      uVar11 = (ulong)(iVar2 + 1);
    }
  }
  iVar1 = iVar1 + test_ret;
  function_tests = function_tests + 1;
  test_ret = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    pxVar10 = (xmlChar *)0x0;
    while( true ) {
      iVar2 = (int)in_RSI;
      iVar3 = (int)pxVar10;
      if (iVar3 == 5) break;
      iVar4 = xmlMemBlocks();
      if (uVar12 == 0) {
        lVar8 = xmlDictCreate();
      }
      else {
        lVar8 = 0;
      }
      in_RSI = gen_const_xmlChar_ptr(iVar3,iVar2);
      xmlDictOwns(lVar8);
      call_tests = call_tests + 1;
      if (lVar8 != 0) {
        xmlDictFree(lVar8);
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar4 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDictOwns",(ulong)(uint)(iVar2 - iVar4));
        test_ret = test_ret + 1;
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar10;
      }
      pxVar10 = (xmlChar *)(ulong)(iVar3 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_44 = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    uVar11 = 0;
    while (iVar2 = (int)uVar11, iVar2 != 5) {
      pxVar10 = (xmlChar *)0x0;
      while( true ) {
        iVar3 = (int)in_RSI;
        iVar4 = (int)pxVar10;
        if (iVar4 == 5) break;
        iVar5 = xmlMemBlocks();
        if (uVar12 == 0) {
          lVar8 = xmlDictCreate();
        }
        else {
          lVar8 = 0;
        }
        in_RSI = gen_const_xmlChar_ptr(iVar2,iVar3);
        pxVar9 = gen_const_xmlChar_ptr(iVar4,iVar3);
        xmlDictQLookup(lVar8,in_RSI,pxVar9);
        call_tests = call_tests + 1;
        if (lVar8 != 0) {
          xmlDictFree(lVar8);
        }
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar5 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDictQLookup",(ulong)(uint)(iVar3 - iVar5));
          local_44 = local_44 + 1;
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar11);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar10;
        }
        pxVar10 = (xmlChar *)(ulong)(iVar4 + 1);
      }
      uVar11 = (ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    iVar3 = xmlMemBlocks();
    if (uVar12 == 0) {
      lVar8 = xmlDictCreate();
    }
    else {
      lVar8 = 0;
    }
    xmlDictReference(lVar8);
    xmlDictFree(lVar8);
    call_tests = call_tests + 1;
    if (lVar8 != 0) {
      xmlDictFree(lVar8);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDictReference",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      printf(" %d",(ulong)uVar12);
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar3 = 0;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    iVar4 = xmlMemBlocks();
    if (uVar12 == 0) {
      lVar8 = xmlDictCreate();
    }
    else {
      lVar8 = 0;
    }
    xmlDictSize(lVar8);
    call_tests = call_tests + 1;
    if (lVar8 != 0) {
      xmlDictFree(lVar8);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDictSize",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      printf(" %d",(ulong)uVar12);
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  xmlInitializeDict();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar5 = xmlMemBlocks();
  if (iVar4 != iVar5) {
    iVar6 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlInitializeDict",(ulong)(uint)(iVar6 - iVar4));
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar12 = iVar2 + iVar3 + iVar1 + local_34 + local_38 + test_ret + local_44 +
           (uint)(iVar4 != iVar5);
  if (uVar12 != 0) {
    printf("Module dict: %d errors\n",(ulong)uVar12);
  }
  return uVar12;
}

Assistant:

static int
test_dict(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing dict : 10 of 13 functions ...\n");
    test_ret += test_xmlDictCleanup();
    test_ret += test_xmlDictCreate();
    test_ret += test_xmlDictCreateSub();
    test_ret += test_xmlDictExists();
    test_ret += test_xmlDictGetUsage();
    test_ret += test_xmlDictLookup();
    test_ret += test_xmlDictOwns();
    test_ret += test_xmlDictQLookup();
    test_ret += test_xmlDictReference();
    test_ret += test_xmlDictSetLimit();
    test_ret += test_xmlDictSize();
    test_ret += test_xmlInitializeDict();

    if (test_ret != 0)
	printf("Module dict: %d errors\n", test_ret);
    return(test_ret);
}